

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerGLSL::register_impure_function_call(CompilerGLSL *this)

{
  SmallVector<unsigned_int,_8UL> *pSVar1;
  uint *puVar2;
  SPIRVariable *pSVar3;
  uint aliased;
  uint *__end1_1;
  uint *__begin1_1;
  SmallVector<unsigned_int,_8UL> *__range1_1;
  uint global;
  uint *__end1;
  uint *__begin1;
  SmallVector<unsigned_int,_8UL> *__range1;
  CompilerGLSL *this_local;
  
  pSVar1 = &(this->super_Compiler).global_variables;
  __end1 = VectorView<unsigned_int>::begin(&pSVar1->super_VectorView<unsigned_int>);
  puVar2 = VectorView<unsigned_int>::end(&pSVar1->super_VectorView<unsigned_int>);
  for (; __end1 != puVar2; __end1 = __end1 + 1) {
    pSVar3 = Compiler::get<spirv_cross::SPIRVariable>(&this->super_Compiler,*__end1);
    Compiler::flush_dependees(&this->super_Compiler,pSVar3);
  }
  pSVar1 = &(this->super_Compiler).aliased_variables;
  __end1_1 = VectorView<unsigned_int>::begin(&pSVar1->super_VectorView<unsigned_int>);
  puVar2 = VectorView<unsigned_int>::end(&pSVar1->super_VectorView<unsigned_int>);
  for (; __end1_1 != puVar2; __end1_1 = __end1_1 + 1) {
    pSVar3 = Compiler::get<spirv_cross::SPIRVariable>(&this->super_Compiler,*__end1_1);
    Compiler::flush_dependees(&this->super_Compiler,pSVar3);
  }
  return;
}

Assistant:

void CompilerGLSL::register_impure_function_call()
{
	// Impure functions can modify globals and aliased variables, so invalidate them as well.
	for (auto global : global_variables)
		flush_dependees(get<SPIRVariable>(global));
	for (auto aliased : aliased_variables)
		flush_dependees(get<SPIRVariable>(aliased));
}